

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVector<slang::SourceBuffer,_4UL>::SmallVector
          (SmallVector<slang::SourceBuffer,_4UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<slang::SourceBuffer>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::SourceBuffer>).firstElement;
  (this->super_SmallVectorBase<slang::SourceBuffer>).len = 0;
  (this->super_SmallVectorBase<slang::SourceBuffer>).cap = 4;
  SmallVectorBase<slang::SourceBuffer>::reserve
            (&this->super_SmallVectorBase<slang::SourceBuffer>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }